

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,StringRef name,int value,StringRef msg)

{
  StringRef msg_00;
  StringRef name_00;
  char *in_RDX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  char *in_R9;
  BasicCStringRef<char> *this_00;
  OptionError *in_stack_ffffffffffffff78;
  CStringRef in_stack_ffffffffffffff80;
  BasicCStringRef<char> in_stack_ffffffffffffffa8;
  
  this_00 = (BasicCStringRef<char> *)&stack0xffffffffffffffa8;
  name_00.size_ = (size_t)in_stack_ffffffffffffffa8.data_;
  name_00.data_ = in_RDX;
  msg_00.size_ = in_RSI;
  msg_00.data_ = in_R9;
  Format<int>(name_00,(int)((ulong)in_R8 >> 0x20),msg_00);
  fmt::BasicCStringRef<char>::BasicCStringRef(this_00,in_RDI);
  OptionError::OptionError(in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__InvalidOptionValue_006e5ae0;
  return;
}

Assistant:

InvalidOptionValue(fmt::StringRef name, T value, fmt::StringRef msg="")
    : OptionError(Format(name, value, msg)) {}